

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

void __thiscall
aeron::ClientConductor::releaseSubscription
          (ClientConductor *this,int64_t registrationId,ImageList *imageList)

{
  bool bVar1;
  ImageList *imageList_00;
  iterator now;
  void *pvVar2;
  long lVar3;
  long *in_RDX;
  long in_RDI;
  ClientConductor *in_stack_00000020;
  size_t i;
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  it;
  lock_guard<std::recursive_mutex> lock;
  Image *in_stack_ffffffffffffff28;
  Image *in_stack_ffffffffffffff30;
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  *in_stack_ffffffffffffff40;
  const_iterator in_stack_ffffffffffffff48;
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  in_stack_ffffffffffffff50;
  long lVar4;
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  in_stack_ffffffffffffff58;
  ClientConductor *this_00;
  ulong local_60;
  __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
  local_28 [2];
  long *local_18;
  
  local_18 = in_RDX;
  verifyDriverIsActiveViaErrorHandler(in_stack_00000020);
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_ffffffffffffff30,
             (mutex_type *)in_stack_ffffffffffffff28);
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  ::begin((vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           *)in_stack_ffffffffffffff28);
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  ::end((vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
         *)in_stack_ffffffffffffff28);
  local_28[0] = std::
                find_if<__gnu_cxx::__normal_iterator<aeron::ClientConductor::SubscriptionStateDefn*,std::vector<aeron::ClientConductor::SubscriptionStateDefn,std::allocator<aeron::ClientConductor::SubscriptionStateDefn>>>,aeron::ClientConductor::releaseSubscription(long,aeron::ImageList*)::__0>
                          (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           in_stack_ffffffffffffff48._M_current);
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  ::end((vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
         *)in_stack_ffffffffffffff28);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
                      *)in_stack_ffffffffffffff30,
                     (__normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
                      *)in_stack_ffffffffffffff28);
  if (bVar1) {
    this_00 = *(ClientConductor **)(in_RDI + 0xc0);
    __gnu_cxx::
    __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
    ::operator*(local_28);
    DriverProxy::removeSubscription
              ((DriverProxy *)in_stack_ffffffffffffff50._M_current,
               (int64_t)in_stack_ffffffffffffff48._M_current);
    for (local_60 = 0; local_60 < (ulong)local_18[1]; local_60 = local_60 + 1) {
      __gnu_cxx::
      __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
      ::operator*(local_28);
      std::function<void_(aeron::Image_&)>::operator()
                ((function<void_(aeron::Image_&)> *)in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28);
    }
    imageList_00 = (ImageList *)(in_RDI + 0x60);
    __gnu_cxx::
    __normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_const*,std::vector<aeron::ClientConductor::SubscriptionStateDefn,std::allocator<aeron::ClientConductor::SubscriptionStateDefn>>>
    ::__normal_iterator<aeron::ClientConductor::SubscriptionStateDefn*>
              ((__normal_iterator<const_aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
                *)in_stack_ffffffffffffff30,
               (__normal_iterator<aeron::ClientConductor::SubscriptionStateDefn_*,_std::vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>_>
                *)in_stack_ffffffffffffff28);
    now = std::
          vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
          ::erase(in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
    std::function<long_long_()>::operator()((function<long_long_()> *)(in_RDI + 0x1d8));
    lingerAllResources(this_00,(longlong)now._M_current,imageList_00);
  }
  else if (local_18 != (long *)0x0) {
    lVar4 = *local_18;
    if (lVar4 != 0) {
      pvVar2 = (void *)(lVar4 + -8);
      lVar3 = lVar4 + *(long *)(lVar4 + -8) * 0x128;
      if (lVar4 != lVar3) {
        do {
          lVar3 = lVar3 + -0x128;
          Image::~Image(in_stack_ffffffffffffff30);
        } while (lVar3 != lVar4);
      }
      operator_delete__(pvVar2);
    }
    if (local_18 != (long *)0x0) {
      operator_delete(local_18);
    }
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1c5a9a);
  return;
}

Assistant:

void ClientConductor::releaseSubscription(std::int64_t registrationId, struct ImageList *imageList)
{
    verifyDriverIsActiveViaErrorHandler();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    auto it = std::find_if(m_subscriptions.begin(), m_subscriptions.end(),
        [registrationId](const SubscriptionStateDefn &entry)
        {
            return registrationId == entry.m_registrationId;
        });

    if (it != m_subscriptions.end())
    {
        m_driverProxy.removeSubscription((*it).m_registrationId);

        for (std::size_t i = 0; i < imageList->m_length; i++)
        {
            (*it).m_onUnavailableImageHandler(imageList->m_images[i]);
        }

        m_subscriptions.erase(it);

        lingerAllResources(m_epochClock(), imageList);
    }
    else if (nullptr != imageList)
    {
        delete[] imageList->m_images;
        delete imageList;
    }
}